

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMockerBase<MockProblemBuilder::Objective_&(int)>::~FunctionMockerBase
          (FunctionMockerBase<MockProblemBuilder::Objective_&(int)> *this)

{
  MutexBase *in_RDI;
  MutexLock l;
  UntypedFunctionMockerBase *in_stack_00000240;
  UntypedFunctionMockerBase *in_stack_fffffffffffffff0;
  
  (in_RDI->mutex_).__align = (long)&PTR__FunctionMockerBase_0039dc48;
  GTestMutexLock::GTestMutexLock((GTestMutexLock *)in_stack_fffffffffffffff0,in_RDI);
  UntypedFunctionMockerBase::VerifyAndClearExpectationsLocked(in_stack_00000240);
  Mock::UnregisterLocked(&this->super_UntypedFunctionMockerBase);
  (**(code **)((in_RDI->mutex_).__align + 0x10))();
  GTestMutexLock::~GTestMutexLock((GTestMutexLock *)0x1a24de);
  MockSpec<MockProblemBuilder::Objective_&(int)>::~MockSpec
            ((MockSpec<MockProblemBuilder::Objective_&(int)> *)0x1a24eb);
  UntypedFunctionMockerBase::~UntypedFunctionMockerBase(in_stack_fffffffffffffff0);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    MutexLock l(&g_gmock_mutex);
    VerifyAndClearExpectationsLocked();
    Mock::UnregisterLocked(this);
    ClearDefaultActionsLocked();
  }